

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_ptr.hpp
# Opt level: O1

void __thiscall
libtorrent::aux::copy_ptr<const_libtorrent::file_storage>::copy_ptr
          (copy_ptr<const_libtorrent::file_storage> *this,
          copy_ptr<const_libtorrent::file_storage> *p)

{
  _Head_base<0UL,_const_libtorrent::file_storage_*,_false> _Var1;
  _Head_base<0UL,_const_libtorrent::file_storage_*,_false> this_00;
  
  _Var1._M_head_impl =
       (p->m_ptr)._M_t.
       super___uniq_ptr_impl<const_libtorrent::file_storage,_std::default_delete<const_libtorrent::file_storage>_>
       ._M_t.
       super__Tuple_impl<0UL,_const_libtorrent::file_storage_*,_std::default_delete<const_libtorrent::file_storage>_>
       .super__Head_base<0UL,_const_libtorrent::file_storage_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (file_storage *)0x0) {
    this_00._M_head_impl = (file_storage *)0x0;
  }
  else {
    this_00._M_head_impl = (file_storage *)operator_new(0xb8);
    file_storage::file_storage(this_00._M_head_impl,_Var1._M_head_impl);
  }
  (this->m_ptr)._M_t.
  super___uniq_ptr_impl<const_libtorrent::file_storage,_std::default_delete<const_libtorrent::file_storage>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_libtorrent::file_storage_*,_std::default_delete<const_libtorrent::file_storage>_>
  .super__Head_base<0UL,_const_libtorrent::file_storage_*,_false>._M_head_impl =
       this_00._M_head_impl;
  return;
}

Assistant:

copy_ptr(copy_ptr const& p): m_ptr(p.m_ptr ? new T(*p.m_ptr) : nullptr) {}